

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

void __thiscall JsonString_Empty_Test::~JsonString_Empty_Test(JsonString_Empty_Test *this)

{
  anon_unknown.dwarf_1a1265::JsonString::~JsonString(&this->super_JsonString);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonString, Empty) {
    EXPECT_CALL (callbacks_, string_value ("")).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_);
    p.input (R"("")"s).eof ();
    EXPECT_FALSE (p.has_error ()) << "Expected the parse to succeed";
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{3U, 1U}));
}